

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O0

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
duckdb::BaseTableRef::Deserialize(Deserializer *deserializer)

{
  pointer pBVar1;
  Deserializer *this;
  pointer this_00;
  Deserializer *in_RSI;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_> in_RDI;
  unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true> result;
  pointer in_stack_ffffffffffffff68;
  unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
  *in_stack_ffffffffffffff70;
  Deserializer *pDVar2;
  field_id_t field_id;
  Deserializer *ret;
  BaseTableRef *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ret_00;
  Deserializer *this_01;
  field_id_t field_id_00;
  _Head_base<0UL,_duckdb::TableRef_*,_false> this_02;
  Deserializer *local_10;
  
  this_02._M_head_impl =
       (TableRef *)
       in_RDI._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  local_10 = in_RSI;
  operator_new(0xd0);
  BaseTableRef(in_stack_ffffffffffffffa0);
  ret_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffffe8;
  unique_ptr<duckdb::BaseTableRef,std::default_delete<duckdb::BaseTableRef>,true>::
  unique_ptr<std::default_delete<duckdb::BaseTableRef>,void>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this_01 = local_10;
  pBVar1 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->(in_stack_ffffffffffffff70);
  field_id_00 = (field_id_t)((ulong)pBVar1 >> 0x30);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            ((Deserializer *)this_02._M_head_impl,field_id_00,(char *)this_01,ret_00);
  ret = local_10;
  pBVar1 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->(in_stack_ffffffffffffff70);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            ((Deserializer *)this_02._M_head_impl,field_id_00,(char *)this_01,ret_00);
  pDVar2 = local_10;
  this = (Deserializer *)
         unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
         operator->(in_stack_ffffffffffffff70);
  field_id = (field_id_t)((ulong)pDVar2 >> 0x30);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (this_01,(field_id_t)((ulong)ret_00 >> 0x30),(char *)pBVar1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)ret);
  pDVar2 = local_10;
  pBVar1 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->(in_stack_ffffffffffffff70);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            ((Deserializer *)this_02._M_head_impl,field_id_00,(char *)this_01,ret_00);
  this_00 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
            operator->(in_stack_ffffffffffffff70);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::AtClause,std::default_delete<duckdb::AtClause>,true>>
            (this,field_id,(char *)pBVar1,
             (unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> *)pDVar2);
  unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>::
  unique_ptr<duckdb::BaseTableRef,std::default_delete<std::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>>>,void>
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)this_00,
             (unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>_> *)
             local_10);
  unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::~unique_ptr
            ((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true> *)
             0xae8c34);
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (__uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         in_RDI._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
         ._M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<TableRef> BaseTableRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<BaseTableRef>(new BaseTableRef());
	deserializer.ReadPropertyWithDefault<string>(200, "schema_name", result->schema_name);
	deserializer.ReadPropertyWithDefault<string>(201, "table_name", result->table_name);
	deserializer.ReadPropertyWithDefault<vector<string>>(202, "column_name_alias", result->column_name_alias);
	deserializer.ReadPropertyWithDefault<string>(203, "catalog_name", result->catalog_name);
	deserializer.ReadPropertyWithDefault<unique_ptr<AtClause>>(204, "at_clause", result->at_clause);
	return std::move(result);
}